

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info.cc
# Opt level: O0

CUIter * __thiscall
bloaty::dwarf::InfoReader::GetCUIter(InfoReader *this,Section section,uint64_t offset)

{
  string_view next_unit;
  Section in_EDX;
  long *in_RSI;
  CUIter *in_RDI;
  string_view data;
  CUIter *data_00;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  Section local_c;
  
  data_00 = in_RDI;
  local_c = in_EDX;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28);
  if (local_c == kDebugInfo) {
    local_28._M_len = *(size_t *)(*in_RSI + 0x30);
    local_28._M_str = *(char **)(*in_RSI + 0x38);
  }
  else {
    local_28._M_len = *(size_t *)(*in_RSI + 0xd0);
    local_28._M_str = *(char **)(*in_RSI + 0xd8);
  }
  SkipBytes((size_t)in_RSI,(string_view *)data_00);
  next_unit._M_str = local_28._M_str;
  next_unit._M_len = local_28._M_len;
  CUIter::CUIter(in_RDI,local_c,next_unit);
  return data_00;
}

Assistant:

CUIter InfoReader::GetCUIter(Section section, uint64_t offset) {
  string_view data;

  if (section == Section::kDebugInfo) {
    data = dwarf_.debug_info;
  } else {
    data = dwarf_.debug_types;
  }

  SkipBytes(offset, &data);
  return CUIter(section, data);
}